

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O3

void __thiscall kj::Refcounted::~Refcounted(Refcounted *this)

{
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  (this->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00211c30;
  _kjCondition.left = &this->refcount;
  _kjCondition.result = this->refcount == 0;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[50]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/refcount.c++"
             ,0x26,FAILED,"refcount == 0",
             "_kjCondition,\"Refcounted object deleted with non-zero refcount.\"",&_kjCondition,
             (char (*) [50])"Refcounted object deleted with non-zero refcount.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Refcounted::~Refcounted() noexcept(false) {
  KJ_ASSERT(refcount == 0, "Refcounted object deleted with non-zero refcount.");
}